

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsFPFunction_MassTDep(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  realtype in_RDX;
  undefined8 in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  N_Vector in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeARKStepMem *)0x117e3ae);
  if (local_4 == 0) {
    N_VLinearSum(in_RDX,in_stack_ffffffffffffffd8,(realtype)in_stack_ffffffffffffffd0,
                 (N_Vector)(ulong)in_stack_ffffffffffffffc8,(N_Vector)0x117e3f0);
    iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0x88))
                      (in_stack_ffffffffffffffd8[0x11].content,
                       in_stack_ffffffffffffffd8[0xb].content,
                       *(undefined8 *)
                        (*(long *)(in_stack_ffffffffffffffd0 + 0x30) +
                        (long)*(int *)(in_stack_ffffffffffffffd0 + 0x58) * 8),
                       in_stack_ffffffffffffffd8->sunctx);
    *(long *)(in_stack_ffffffffffffffd0 + 0x178) = *(long *)(in_stack_ffffffffffffffd0 + 0x178) + 1;
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      N_VScale((realtype)in_stack_ffffffffffffffd0,
               (N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(N_Vector)0x117e4a6);
      iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0x150))
                        (*(undefined8 *)(in_stack_ffffffffffffffd0 + 0xe0),in_stack_ffffffffffffffd8
                         ,in_RSI);
      if (iVar1 < 0) {
        local_4 = -8;
      }
      else if (iVar1 < 1) {
        N_VLinearSum(in_RDX,in_stack_ffffffffffffffd8,(realtype)in_stack_ffffffffffffffd0,
                     (N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(N_Vector)0x117e514);
        local_4 = 0;
      }
      else {
        local_4 = 9;
      }
    }
    else {
      local_4 = 9;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsFPFunction_MassTDep(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsFPFunction_MassTDep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS and save for later */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* copy step_mem->gamma*Fi into g */
  N_VScale(step_mem->gamma, step_mem->Fi[step_mem->istage], g);

  /* perform mass matrix solve */
  retval = step_mem->msolve((void *) ark_mem, g, step_mem->nlscoef);
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* combine parts:  g = g + sdata */
  N_VLinearSum(ONE, g, ONE, step_mem->sdata, g);

  return(ARK_SUCCESS);
}